

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *field,Reader *replacement)

{
  bool bVar1;
  uint16_t uVar2;
  Which WVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint local_420;
  uint local_418;
  Fault local_400;
  Fault f_2;
  Reader local_3c8;
  Maybe<capnp::schema::Field::Reader> local_398;
  Maybe<capnp::schema::Node::Reader> local_360;
  Reader local_328;
  Reader local_2f8;
  Reader local_2c8;
  Maybe<capnp::schema::Field::Reader> local_298;
  Maybe<capnp::schema::Node::Reader> local_260;
  Reader local_228;
  Reader local_1f8;
  Fault local_1c8;
  Fault f_1;
  Reader local_190;
  Reader local_160;
  Reader local_130;
  undefined1 local_100 [8];
  Reader replacementSlot;
  Reader slot;
  Fault local_98;
  Fault f;
  uint replacementDiscriminant;
  undefined1 local_78 [4];
  uint discriminant;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:798:5)>
  _kjContext798;
  anon_class_8_1_a7e8901a _kjContextFunc798;
  Reader *replacement_local;
  Reader *field_local;
  CompatibilityChecker *this_local;
  
  _kjContext798.func = (anon_class_8_1_a7e8901a *)field;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++:798:5)>
  ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:798:5)>
                 *)local_78,(anon_class_8_1_a7e8901a *)&_kjContext798.func);
  bVar1 = hasDiscriminantValue(field);
  if (bVar1) {
    uVar2 = capnp::schema::Field::Reader::getDiscriminantValue(field);
    local_418 = (uint)uVar2;
  }
  else {
    local_418 = 0;
  }
  bVar1 = hasDiscriminantValue(replacement);
  if (bVar1) {
    uVar2 = capnp::schema::Field::Reader::getDiscriminantValue(replacement);
    local_420 = (uint)uVar2;
  }
  else {
    local_420 = 0;
  }
  f.exception._0_4_ = local_420;
  if (local_418 == local_420) {
    WVar3 = capnp::schema::Field::Reader::which(field);
    if (WVar3 == SLOT) {
      capnp::schema::Field::Reader::getSlot((Reader *)&replacementSlot._reader.nestingLimit,field);
      WVar3 = capnp::schema::Field::Reader::which(replacement);
      if (WVar3 == SLOT) {
        capnp::schema::Field::Reader::getSlot((Reader *)local_100,replacement);
        capnp::schema::Field::Slot::Reader::getType
                  (&local_130,(Reader *)&replacementSlot._reader.nestingLimit);
        capnp::schema::Field::Slot::Reader::getType(&local_160,(Reader *)local_100);
        checkCompatibility(this,&local_130,&local_160,NO_UPGRADE_TO_STRUCT);
        capnp::schema::Field::Slot::Reader::getDefaultValue
                  (&local_190,(Reader *)&replacementSlot._reader.nestingLimit);
        capnp::schema::Field::Slot::Reader::getDefaultValue((Reader *)&f_1,(Reader *)local_100);
        checkDefaultCompatibility(this,&local_190,(Reader *)&f_1);
        uVar4 = capnp::schema::Field::Slot::Reader::getOffset
                          ((Reader *)&replacementSlot._reader.nestingLimit);
        uVar5 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)local_100);
        if (uVar4 != uVar5) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                    (&local_1c8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x335,FAILED,"slot.getOffset() == replacementSlot.getOffset()",
                     "\"field position changed\"",(char (*) [23])"field position changed");
          this->compatibility = INCOMPATIBLE;
          kj::_::Debug::Fault::~Fault(&local_1c8);
        }
      }
      else if (WVar3 == GROUP) {
        capnp::schema::Field::Slot::Reader::getType
                  (&local_1f8,(Reader *)&replacementSlot._reader.nestingLimit);
        capnp::schema::Field::Reader::getGroup(&local_228,replacement);
        uVar6 = capnp::schema::Field::Group::Reader::getTypeId(&local_228);
        kj::Maybe<capnp::schema::Node::Reader>::Maybe(&local_260,&this->existingNode);
        kj::Maybe<capnp::schema::Field::Reader>::Maybe(&local_298,field);
        checkUpgradeToStruct(this,&local_1f8,uVar6,&local_260,&local_298);
        kj::Maybe<capnp::schema::Field::Reader>::~Maybe(&local_298);
        kj::Maybe<capnp::schema::Node::Reader>::~Maybe(&local_260);
      }
    }
    else if (WVar3 == GROUP) {
      WVar3 = capnp::schema::Field::Reader::which(replacement);
      if (WVar3 == SLOT) {
        capnp::schema::Field::Reader::getSlot(&local_2f8,replacement);
        capnp::schema::Field::Slot::Reader::getType(&local_2c8,&local_2f8);
        capnp::schema::Field::Reader::getGroup(&local_328,field);
        uVar6 = capnp::schema::Field::Group::Reader::getTypeId(&local_328);
        kj::Maybe<capnp::schema::Node::Reader>::Maybe(&local_360,&this->replacementNode);
        kj::Maybe<capnp::schema::Field::Reader>::Maybe(&local_398,replacement);
        checkUpgradeToStruct(this,&local_2c8,uVar6,&local_360,&local_398);
        kj::Maybe<capnp::schema::Field::Reader>::~Maybe(&local_398);
        kj::Maybe<capnp::schema::Node::Reader>::~Maybe(&local_360);
      }
      else if (WVar3 == GROUP) {
        capnp::schema::Field::Reader::getGroup(&local_3c8,field);
        uVar6 = capnp::schema::Field::Group::Reader::getTypeId(&local_3c8);
        capnp::schema::Field::Reader::getGroup((Reader *)&f_2,replacement);
        uVar7 = capnp::schema::Field::Group::Reader::getTypeId((Reader *)&f_2);
        if (uVar6 != uVar7) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[17]>
                    (&local_400,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x349,FAILED,
                     "field.getGroup().getTypeId() == replacement.getGroup().getTypeId()",
                     "\"group id changed\"",(char (*) [17])"group id changed");
          this->compatibility = INCOMPATIBLE;
          kj::_::Debug::Fault::~Fault(&local_400);
        }
      }
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              (&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x325,FAILED,"discriminant == replacementDiscriminant",
               "\"Field discriminant changed.\"",(char (*) [28])"Field discriminant changed.");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&local_98);
  }
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++:798:5)>
  ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:798:5)>
                  *)local_78);
  return;
}

Assistant:

void checkCompatibility(const schema::Field::Reader& field,
                          const schema::Field::Reader& replacement) {
    KJ_CONTEXT("comparing struct field", field.getName());

    // A field that is initially not in a union can be upgraded to be in one, as long as it has
    // discriminant 0.
    uint discriminant = hasDiscriminantValue(field) ? field.getDiscriminantValue() : 0;
    uint replacementDiscriminant =
        hasDiscriminantValue(replacement) ? replacement.getDiscriminantValue() : 0;
    VALIDATE_SCHEMA(discriminant == replacementDiscriminant, "Field discriminant changed.");

    switch (field.which()) {
      case schema::Field::SLOT: {
        auto slot = field.getSlot();

        switch (replacement.which()) {
          case schema::Field::SLOT: {
            auto replacementSlot = replacement.getSlot();

            checkCompatibility(slot.getType(), replacementSlot.getType(),
                               NO_UPGRADE_TO_STRUCT);
            checkDefaultCompatibility(slot.getDefaultValue(),
                                      replacementSlot.getDefaultValue());

            VALIDATE_SCHEMA(slot.getOffset() == replacementSlot.getOffset(),
                            "field position changed");
            break;
          }
          case schema::Field::GROUP:
            checkUpgradeToStruct(slot.getType(), replacement.getGroup().getTypeId(),
                                 existingNode, field);
            break;
        }

        break;
      }

      case schema::Field::GROUP:
        switch (replacement.which()) {
          case schema::Field::SLOT:
            checkUpgradeToStruct(replacement.getSlot().getType(), field.getGroup().getTypeId(),
                                 replacementNode, replacement);
            break;
          case schema::Field::GROUP:
            VALIDATE_SCHEMA(field.getGroup().getTypeId() == replacement.getGroup().getTypeId(),
                            "group id changed");
            break;
        }
        break;
    }
  }